

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::createShader(SingleBindingCase *this)

{
  bool bVar1;
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  TestError *this_01;
  long lVar2;
  char *pcVar3;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  long *local_2c0;
  long local_2b8;
  long local_2b0 [2];
  uint local_2a0;
  value_type local_298;
  undefined1 local_278 [8];
  value_type local_270 [3];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  bVar1 = (this->m_spec).hasColorAttr;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"#version 310 es\nin highp vec4 a_position;\n",0x2a);
  pcVar3 = "uniform highp vec4 u_color;\n";
  if (bVar1 != false) {
    pcVar3 = "in highp vec4 a_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,pcVar3,(ulong)(bVar1 ^ 1) * 5 + 0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,
             "out highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = "
             ,0x51);
  pcVar3 = "u_color";
  if (bVar1 != false) {
    pcVar3 = "a_color";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar3,7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,";\n}\n",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2a0 = 0;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2c0,local_2b8 + (long)local_2c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a0,&local_298);
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,
             "#version 310 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,"");
  local_278._0_4_ = 1;
  local_270[0]._M_dataplus._M_p = (pointer)&local_270[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_270,local_2e0,local_2d8 + (long)local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + ((ulong)local_278 & 0xffffffff),local_270);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  (this->super_BindingRenderCase).m_program = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270[0]._M_dataplus._M_p != &local_270[0].field_2) {
    operator_delete(local_270[0]._M_dataplus._M_p,local_270[0].field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0,local_2b0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar2 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  glu::operator<<(((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log,(this->super_BindingRenderCase).m_program);
  if ((((this->super_BindingRenderCase).m_program)->m_program).m_info.linkOk != false) {
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  local_278 = (undefined1  [8])&local_270[0]._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"could not build shader","");
  tcu::TestError::TestError(this_01,(string *)local_278);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SingleBindingCase::createShader (void)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource()) << glu::FragmentSource(s_colorFragmentShader));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build shader");
}